

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

int anon_unknown.dwarf_10db0::extract_job_number(string *command,string *jobString)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  unsigned_long local_28;
  unsigned_long numJobs;
  string *psStack_18;
  int jobs;
  string *jobString_local;
  string *command_local;
  
  numJobs._4_4_ = -1;
  local_28 = 0;
  psStack_18 = jobString;
  jobString_local = command;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = cmStrToULong(psStack_18,&local_28);
    if (bVar1) {
      if (local_28 == 0) {
        std::operator<<((ostream *)&std::cerr,
                        "The <jobs> value requires a positive integer argument.\n\n");
      }
      else if (local_28 < 0x80000000) {
        numJobs._4_4_ = (int)local_28;
      }
      else {
        std::operator<<((ostream *)&std::cerr,"The <jobs> value is too large.\n\n");
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"\'");
      poVar3 = std::operator<<(poVar3,(string *)jobString_local);
      poVar3 = std::operator<<(poVar3,"\' invalid number \'");
      poVar3 = std::operator<<(poVar3,(string *)psStack_18);
      std::operator<<(poVar3,"\' given.\n\n");
    }
  }
  else {
    numJobs._4_4_ = 0;
  }
  return numJobs._4_4_;
}

Assistant:

int extract_job_number(std::string const& command,
                       std::string const& jobString)
{
  int jobs = -1;
  unsigned long numJobs = 0;
  if (jobString.empty()) {
    jobs = cmake::DEFAULT_BUILD_PARALLEL_LEVEL;
  } else if (cmStrToULong(jobString, &numJobs)) {
    if (numJobs == 0) {
      std::cerr
        << "The <jobs> value requires a positive integer argument.\n\n";
    } else if (numJobs > INT_MAX) {
      std::cerr << "The <jobs> value is too large.\n\n";
    } else {
      jobs = static_cast<int>(numJobs);
    }
  } else {
    std::cerr << "'" << command << "' invalid number '" << jobString
              << "' given.\n\n";
  }
  return jobs;
}